

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::VariableDatum::GetDatumValueAsKString_abi_cxx11_
          (KString *__return_storage_ptr__,VariableDatum *this)

{
  bool bVar1;
  pointer pDVar2;
  double dVar3;
  ushort local_1ba;
  uint uStack_1b4;
  KUINT16 j;
  KUINT32 ui32LengthInOctets;
  KUINT32 i;
  const_iterator citrEnd;
  const_iterator citr;
  KStringStream ss;
  ostream local_190 [376];
  VariableDatum *local_18;
  VariableDatum *this_local;
  
  local_18 = this;
  this_local = (VariableDatum *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&citr);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
            ::begin(&this->m_v8DatumValue);
  _ui32LengthInOctets =
       std::
       vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
       ::end(&this->m_v8DatumValue);
  uStack_1b4 = 0;
  dVar3 = ceil((double)this->m_ui32DatumLength * 0.125);
  while (bVar1 = __gnu_cxx::operator!=
                           (&citrEnd,(__normal_iterator<const_KDIS::DATA_TYPE::VariableDatum::DatumEntry_*,_std::vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>_>
                                      *)&ui32LengthInOctets), bVar1) {
    local_1ba = 0;
    for (; uStack_1b4 < (uint)(long)dVar3 && local_1ba < 8; uStack_1b4 = uStack_1b4 + 1) {
      pDVar2 = __gnu_cxx::
               __normal_iterator<const_KDIS::DATA_TYPE::VariableDatum::DatumEntry_*,_std::vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>_>
               ::operator->(&citrEnd);
      std::operator<<(local_190,pDVar2->Buffer[local_1ba]);
      local_1ba = local_1ba + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::VariableDatum::DatumEntry_*,_std::vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&citr);
  return __return_storage_ptr__;
}

Assistant:

KString VariableDatum::GetDatumValueAsKString() const
{
    KStringStream ss;

    vector<DatumEntry>::const_iterator citr =  m_v8DatumValue.begin();
    vector<DatumEntry>::const_iterator citrEnd = m_v8DatumValue.end();

    KUINT32 i = 0;

    KUINT32 ui32LengthInOctets = ceil(m_ui32DatumLength / 8.0);

    while( citr != citrEnd )
    {
        for( KUINT16 j = 0; i < ui32LengthInOctets && j < 8; ++j, ++i )
        {
            ss << citr->Buffer[j];
        }
        ++citr;
    }

    return ss.str();
}